

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

int AF_A_JumpIfMasterCloser
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  int iVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  AActor *target;
  char *__assertion;
  int in_R9D;
  bool bVar6;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          uVar4 = (**(code **)*puVar1)(puVar1);
          puVar1[1] = uVar4;
        }
        pPVar5 = (PClass *)puVar1[1];
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar2 && bVar6) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar6 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar2) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0064469b;
        }
      }
      target = (AActor *)puVar1[0x4a];
      if ((target != (AActor *)0x0) &&
         (((target->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        puVar1[0x4a] = 0;
        target = (AActor *)0x0;
      }
      iVar3 = DoJumpIfCloser(target,(VMFrameStack *)param,(VMValue *)(ulong)(uint)numparam,(int)ret,
                             (VMReturn *)(ulong)(uint)numret,in_R9D);
      return iVar3;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0064469b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x50a,
                "int AF_A_JumpIfMasterCloser(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfMasterCloser)
{
	PARAM_SELF_PROLOGUE(AActor);
	return DoJumpIfCloser(self->master, VM_ARGS_NAMES);
}